

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall Assimp::IFC::Schema_2x3::IfcRelConnects::~IfcRelConnects(IfcRelConnects *this)

{
  code *pcVar1;
  _func_int *p_Var2;
  long *plVar3;
  long *plVar4;
  
  p_Var2 = (this->super_IfcRelationship).super_IfcRoot.
           super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>._vptr_ObjectHelper[-3];
  pcVar1 = p_Var2 + 0x10 +
           (long)&(this->super_IfcRelationship).super_IfcRoot.Description.ptr._M_dataplus;
  *(long *)(pcVar1 + -0x70) = 0x81ac80;
  *(long *)(pcVar1 + 0x38) = 0x81aca8;
  if (*(code **)(pcVar1 + -0x10) != pcVar1) {
    operator_delete(*(code **)(pcVar1 + -0x10),*(long *)pcVar1 + 1);
  }
  if (*(code **)(p_Var2 + (long)&(this->super_IfcRelationship).super_IfcRoot.Name.ptr._M_dataplus)
      != p_Var2 + 0x10 + (long)&(this->super_IfcRelationship).super_IfcRoot.Name.ptr._M_dataplus) {
    operator_delete(*(code **)(p_Var2 + (long)&(this->super_IfcRelationship).super_IfcRoot.Name.ptr.
                                               _M_dataplus),
                    *(long *)(p_Var2 + 0x10 +
                             (long)&(this->super_IfcRelationship).super_IfcRoot.Name.ptr._M_dataplus
                             ) + 1);
  }
  plVar3 = *(long **)(&(this->super_IfcRelationship).super_IfcRoot.
                       super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>.field_0x10 +
                     (long)p_Var2);
  plVar4 = (long *)(&(this->super_IfcRelationship).super_IfcRoot.
                     super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>.field_0x20 +
                   (long)p_Var2);
  if (plVar3 != plVar4) {
    operator_delete(plVar3,*plVar4 + 1);
    return;
  }
  return;
}

Assistant:

IfcRelConnects() : Object("IfcRelConnects") {}